

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pfd.h
# Opt level: O0

bool __thiscall pfd::internal::executor::ready(executor *this,int timeout)

{
  ulong uVar1;
  int *piVar2;
  byte *in_RDI;
  pid_t child;
  int status;
  ssize_t received;
  char buf [8192];
  duration<long,std::ratio<1l,1000l>> local_2068 [12];
  __pid_t local_205c;
  uint local_2058 [2];
  duration<long,_std::ratio<1L,_1000L>_> *in_stack_ffffffffffffdfb0;
  allocator local_2041;
  string local_2040 [32];
  ulong local_2020;
  char local_2018 [8196];
  int local_14 [4];
  bool local_1;
  
  if ((*in_RDI & 1) == 0) {
    return true;
  }
  uVar1 = read(*(int *)(in_RDI + 0x30),local_2018,0x2000);
  local_2020 = uVar1;
  if ((long)uVar1 < 1) {
    local_205c = waitpid(*(__pid_t *)(in_RDI + 0x2c),(int *)local_2058,1);
    if ((local_205c == *(int *)(in_RDI + 0x2c)) ||
       ((local_205c < 0 && (piVar2 = __errno_location(), *piVar2 == 10)))) {
      close(*(int *)(in_RDI + 0x30));
      *(int *)(in_RDI + 0x28) = (int)(local_2058[0] & 0xff00) >> 8;
      *in_RDI = 0;
      local_1 = true;
    }
    else {
      std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>(local_2068,local_14);
      std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(in_stack_ffffffffffffdfb0);
      local_1 = false;
    }
    return local_1;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2040,local_2018,uVar1,&local_2041);
  std::__cxx11::string::operator+=((string *)(in_RDI + 8),local_2040);
  std::__cxx11::string::~string(local_2040);
  std::allocator<char>::~allocator((allocator<char> *)&local_2041);
  return false;
}

Assistant:

inline bool internal::executor::ready(int timeout /* = default_wait_timeout */)
{
    if (!m_running)
        return true;

#if _WIN32
    if (m_future.valid())
    {
        auto status = m_future.wait_for(std::chrono::milliseconds(timeout));
        if (status != std::future_status::ready)
        {
            // On Windows, we need to run the message pump. If the async
            // thread uses a Windows API dialog, it may be attached to the
            // main thread and waiting for messages that only we can dispatch.
            MSG msg;
            while (PeekMessage(&msg, nullptr, 0, 0, PM_REMOVE))
            {
                TranslateMessage(&msg);
                DispatchMessage(&msg);
            }
            return false;
        }

        m_stdout = m_future.get();
    }
#elif __EMSCRIPTEN__ || __NX__
    // FIXME: do something
    (void)timeout;
#else
    char buf[BUFSIZ];
    ssize_t received = read(m_fd, buf, BUFSIZ); // Flawfinder: ignore
    if (received > 0)
    {
        m_stdout += std::string(buf, received);
        return false;
    }

    // Reap child process if it is dead. It is possible that the system has already reaped it
    // (this happens when the calling application handles or ignores SIG_CHLD) and results in
    // waitpid() failing with ECHILD. Otherwise we assume the child is running and we sleep for
    // a little while.
    int status;
    pid_t child = waitpid(m_pid, &status, WNOHANG);
    if (child != m_pid && (child >= 0 || errno != ECHILD))
    {
        // FIXME: this happens almost always at first iteration
        std::this_thread::sleep_for(std::chrono::milliseconds(timeout));
        return false;
    }

    close(m_fd);
    m_exit_code = WEXITSTATUS(status);
#endif

    m_running = false;
    return true;
}